

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

int __thiscall kj::Canceler::AdapterBase::unlink(AdapterBase *this,char *__name)

{
  Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&> *pMVar1;
  Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&> local_48 [2];
  Maybe<kj::Canceler::AdapterBase_&> local_38;
  AdapterBase *local_30;
  AdapterBase *n;
  AdapterBase *_n261;
  Maybe<kj::Canceler::AdapterBase_&> *p;
  Maybe<kj::Canceler::AdapterBase_&> *_p258;
  AdapterBase *this_local;
  
  _p258 = (Maybe<kj::Canceler::AdapterBase_&> *)this;
  p = kj::_::readMaybe<kj::Maybe<kj::Canceler::AdapterBase&>>(&this->prev);
  if ((AdapterBase *)p != (AdapterBase *)0x0) {
    _n261 = (AdapterBase *)p;
    Maybe<kj::Canceler::AdapterBase_&>::operator=(p,&this->next);
  }
  n = kj::_::readMaybe<kj::Canceler::AdapterBase>(&this->next);
  if (n != (AdapterBase *)0x0) {
    local_30 = n;
    Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&>::operator=(&n->prev,&this->prev);
  }
  Maybe<kj::Canceler::AdapterBase_&>::Maybe(&local_38);
  Maybe<kj::Canceler::AdapterBase_&>::operator=(&this->next,&local_38);
  Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&>::Maybe(local_48);
  pMVar1 = Maybe<kj::Maybe<kj::Canceler::AdapterBase_&>_&>::operator=(&this->prev,local_48);
  return (int)pMVar1;
}

Assistant:

void Canceler::AdapterBase::unlink() {
  KJ_IF_SOME(p, prev) {
    p = next;
  }
  KJ_IF_SOME(n, next) {
    n.prev = prev;
  }
  next = kj::none;
  prev = kj::none;
}